

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[6],unsigned_long&,char_const(&)[3],unsigned_int,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [6],unsigned_long *params_1,
          char (*params_2) [3],uint *params_3,char (*params_4) [3])

{
  char (*value) [6];
  kj *this_00;
  char (*pacVar1) [3];
  uint *value_00;
  unsigned_long *value_01;
  String *params_4_00;
  ArrayPtr<const_char> local_a8;
  CappedArray<char,_14UL> local_98;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_26UL> local_70;
  ArrayPtr<const_char> local_48;
  char (*local_38) [3];
  char (*params_local_4) [3];
  uint *params_local_3;
  char (*params_local_2) [3];
  unsigned_long *params_local_1;
  char (*params_local) [6];
  
  params_4_00 = __return_storage_ptr__;
  local_38 = (char (*) [3])params_3;
  params_local_4 = params_2;
  params_local_3 = (uint *)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (unsigned_long *)this;
  params_local = (char (*) [6])__return_storage_ptr__;
  value = ::const((char (*) [6])this);
  local_48 = toCharSequence<char_const(&)[6]>(value);
  this_00 = (kj *)fwd<unsigned_long&>((unsigned_long *)params_local_2);
  toCharSequence<unsigned_long&>(&local_70,this_00,value_01);
  pacVar1 = ::const((char (*) [3])params_local_3);
  local_80 = toCharSequence<char_const(&)[3]>(pacVar1);
  value_00 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_4);
  toCharSequence<unsigned_int>(&local_98,value_00);
  pacVar1 = ::const(local_38);
  local_a8 = toCharSequence<char_const(&)[3]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_48,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_26UL> *)&local_80,(ArrayPtr<const_char> *)&local_98,
             (CappedArray<char,_14UL> *)&local_a8,(ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}